

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O2

void __thiscall AdsDevice::AdsDevice(AdsDevice *this,string *ipV4,AmsNetId netId,uint16_t port)

{
  long lVar1;
  pointer __p;
  pointer __p_00;
  AdsException *this_00;
  function<long_(AmsNetId)> fStack_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  function<long_(long)> local_50;
  
  lVar1 = bhf::ads::AddLocalRoute(netId,(ipV4->_M_dataplus)._M_p);
  if (lVar1 == 0) {
    __p = (pointer)operator_new(6);
    *(int *)__p->b = netId.b._0_4_;
    *(short *)(__p->b + 4) = netId.b._4_2_;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<long_(AmsNetId),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLib/AdsDevice.cpp:21:47)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<long_(AmsNetId),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLib/AdsDevice.cpp:21:47)>
               ::_M_manager;
    std::function<long_(AmsNetId)>::function(&fStack_98,(function<long_(AmsNetId)> *)&local_78);
    std::unique_ptr<AmsNetId_const,ResourceDeleter<AmsNetId_const>>::
    unique_ptr<ResourceDeleter<AmsNetId_const>,void>
              ((unique_ptr<AmsNetId_const,ResourceDeleter<AmsNetId_const>> *)this,__p,
               (__enable_if_t<_is_lvalue_reference<ResourceDeleter<const_AmsNetId>_>::value,_ResourceDeleter<const_AmsNetId>_&&>
                )&fStack_98);
    std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    *(short *)((this->m_Addr).netId.b + 4) = netId.b._4_2_;
    *(int *)(this->m_Addr).netId.b = netId.b._0_4_;
    (this->m_Addr).port = port;
    __p_00 = (pointer)operator_new(8);
    lVar1 = AdsPortOpenEx();
    local_50.super__Function_base._M_functor._8_8_ = 0;
    *__p_00 = lVar1;
    local_50.super__Function_base._M_functor._M_unused._M_function_pointer = AdsPortCloseEx;
    local_50._M_invoker = std::_Function_handler<long_(long),_long_(*)(long)>::_M_invoke;
    local_50.super__Function_base._M_manager =
         std::_Function_handler<long_(long),_long_(*)(long)>::_M_manager;
    std::function<long_(long)>::function((function<long_(long)> *)&fStack_98,&local_50);
    std::unique_ptr<long_const,ResourceDeleter<long_const>>::
    unique_ptr<ResourceDeleter<long_const>,void>
              ((unique_ptr<long_const,ResourceDeleter<long_const>> *)&this->m_LocalPort,__p_00,
               (__enable_if_t<_is_lvalue_reference<ResourceDeleter<const_long>_>::value,_ResourceDeleter<const_long>_&&>
                )&fStack_98);
    std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    return;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,lVar1);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsDevice::AdsDevice(const std::string& ipV4, AmsNetId netId, uint16_t port)
    : m_NetId(AddRoute(netId, ipV4.c_str()), {[](AmsNetId ams){bhf::ads::DelLocalRoute(ams); return 0; }}),
    m_Addr({netId, port}),
    m_LocalPort(new long { AdsPortOpenEx() }, {AdsPortCloseEx})
{}